

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O0

int16_t __thiscall icu_63::NFRule::expectedExponent(NFRule *this)

{
  uint64_t uVar1;
  double dVar2;
  double dVar3;
  int64_t temp;
  int16_t tempResult;
  NFRule *this_local;
  
  if ((this->radix == 0) || (this->baseValue < 1)) {
    this_local._6_2_ = 0;
  }
  else {
    dVar2 = uprv_log_63((double)this->baseValue);
    dVar3 = uprv_log_63((double)this->radix);
    temp._6_2_ = (short)(int)(dVar2 / dVar3);
    uVar1 = util64_pow(this->radix,temp._6_2_ + 1);
    if ((long)uVar1 <= this->baseValue) {
      temp._6_2_ = temp._6_2_ + 1;
    }
    this_local._6_2_ = temp._6_2_;
  }
  return this_local._6_2_;
}

Assistant:

int16_t
NFRule::expectedExponent() const
{
    // since the log of 0, or the log base 0 of something, causes an
    // error, declare the exponent in these cases to be 0 (we also
    // deal with the special-rule identifiers here)
    if (radix == 0 || baseValue < 1) {
        return 0;
    }

    // we get rounding error in some cases-- for example, log 1000 / log 10
    // gives us 1.9999999996 instead of 2.  The extra logic here is to take
    // that into account
    int16_t tempResult = (int16_t)(uprv_log((double)baseValue) / uprv_log((double)radix));
    int64_t temp = util64_pow(radix, tempResult + 1);
    if (temp <= baseValue) {
        tempResult += 1;
    }
    return tempResult;
}